

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O0

int SUNLinSolSetScalingVectors_SPGMR(SUNLinearSolver S,N_Vector s1,N_Vector s2)

{
  N_Vector s2_local;
  N_Vector s1_local;
  SUNLinearSolver S_local;
  
  if (S == (SUNLinearSolver)0x0) {
    S_local._4_4_ = -1;
  }
  else {
    *(N_Vector *)((long)S->content + 0x50) = s1;
    *(N_Vector *)((long)S->content + 0x58) = s2;
    *(undefined8 *)((long)S->content + 0x20) = 0;
    S_local._4_4_ = (int)*(undefined8 *)((long)S->content + 0x20);
  }
  return S_local._4_4_;
}

Assistant:

int SUNLinSolSetScalingVectors_SPGMR(SUNLinearSolver S, N_Vector s1,
                                     N_Vector s2)
{
  /* set N_Vector pointers to integrator-supplied scaling vectors, 
     and return with success */
  if (S == NULL) return(SUNLS_MEM_NULL);
  SPGMR_CONTENT(S)->s1 = s1;
  SPGMR_CONTENT(S)->s2 = s2;
  LASTFLAG(S) = SUNLS_SUCCESS;
  return(LASTFLAG(S));
}